

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_partitioner.hpp
# Opt level: O0

bool __thiscall
oqpi::simple_partitioner::getNextValidRange
          (simple_partitioner *this,int32_t *fromIndex,int32_t *toIndex)

{
  bool bVar1;
  __int_type_conflict1 batchIndex_00;
  int32_t iVar2;
  __int_type_conflict1 batchIndex;
  int32_t *toIndex_local;
  int32_t *fromIndex_local;
  simple_partitioner *this_local;
  
  batchIndex_00 =
       std::__atomic_base<int>::operator++(&(this->batchIndex_).super___atomic_base<int>,0);
  bVar1 = batchIndex_00 < (this->super_base_partitioner).batchCount_;
  if (bVar1) {
    iVar2 = firstIndexOfBatch(this,batchIndex_00);
    *fromIndex = iVar2;
    iVar2 = lastIndexOfBatch(this,batchIndex_00);
    *toIndex = iVar2;
  }
  return bVar1;
}

Assistant:

inline bool getNextValidRange(int32_t &fromIndex, int32_t &toIndex)
        {
            const auto batchIndex = batchIndex_++;
            if (batchIndex >= batchCount_)
            {
                // All batches have been processed
                return false;
            }
            
            // Return the range [fromIndex; toIndex[
            fromIndex = firstIndexOfBatch(batchIndex);
            toIndex   = lastIndexOfBatch(batchIndex);

            return true;
        }